

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::i2p_peer::i2p_peer
          (i2p_peer *this,string_view dest,bool connectable_,peer_source_flags_t src)

{
  torrent_peer::torrent_peer(&this->super_torrent_peer,0,connectable_,src);
  string_ptr::string_ptr(&this->destination,dest);
  *(uint *)&(this->super_torrent_peer).field_0x1b =
       *(uint *)&(this->super_torrent_peer).field_0x1b & 0xfcffffff | 0x2000000;
  return;
}

Assistant:

i2p_peer::i2p_peer(string_view dest, bool connectable_
		, peer_source_flags_t const src)
		: torrent_peer(0, connectable_, src)
		, destination(dest)
	{
		is_v6_addr = false;
		is_i2p_addr = true;
#if TORRENT_USE_RTC
        is_rtc_addr = false;
#endif
	}